

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

int armci_msg_rcvany(int tag,void *buffer,int len,int *msglen)

{
  int iVar1;
  MPI_Comm poVar2;
  long in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  int in_EDI;
  int rc;
  int flag;
  int rank;
  MPI_Status status;
  MPI_Request request;
  MPI_Comm comm;
  int local_50;
  undefined1 local_4c [4];
  int local_48 [6];
  undefined1 local_30 [8];
  MPI_Comm local_28;
  long local_20;
  undefined4 local_14;
  undefined8 local_10;
  int local_4;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  local_28 = wc();
  local_50 = 0;
  iVar1 = MPI_Comm_rank(local_28,local_4c);
  if (iVar1 != 0) {
    __assert_fail("MPI_SUCCESS == rc",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0x1b9,"int armci_msg_rcvany(int, void *, int, int *)");
  }
  if (local_4 == 0x6be8) {
    __assert_fail("COMEX_TAG != tag",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0x1bb,"int armci_msg_rcvany(int, void *, int, int *)");
  }
  poVar2 = wc();
  iVar1 = MPI_Irecv(local_10,local_14,&ompi_mpi_char,0xffffffff,local_4,poVar2,local_30);
  if (iVar1 != 0) {
    __assert_fail("MPI_SUCCESS == rc",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0x1be,"int armci_msg_rcvany(int, void *, int, int *)");
  }
  do {
    MPI_Test(local_30,&local_50,local_48);
    comex_make_progress();
  } while (local_50 == 0);
  if ((local_20 != 0) && (iVar1 = MPI_Get_count(local_48,&ompi_mpi_char,local_20), iVar1 != 0)) {
    __assert_fail("MPI_SUCCESS == rc",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0x1c9,"int armci_msg_rcvany(int, void *, int, int *)");
  }
  return local_48[0];
}

Assistant:

int armci_msg_rcvany(int tag, void* buffer, int len, int *msglen)
{
    MPI_Comm comm = wc();
    MPI_Request request;
    MPI_Status status;
    int rank;
    int flag = 0;
    int rc;

    rc = MPI_Comm_rank(comm, &rank);
    assert(MPI_SUCCESS == rc);
#if COMEX_NETWORK_MPI_TS
    assert(COMEX_TAG != tag);
#endif
    rc = MPI_Irecv(buffer, len, MPI_CHAR, MPI_ANY_SOURCE, tag, wc(), &request);
    assert(MPI_SUCCESS == rc);
    do {
        MPI_Test(&request, &flag, &status);
        assert(MPI_SUCCESS == rc);
#if COMEX_NETWORK_MPI_TS
        comex_make_progress();
#endif
    } while (!flag);

    if(msglen) {
        rc = MPI_Get_count(&status, MPI_CHAR, msglen);
        assert(MPI_SUCCESS == rc);
    }

    return (int)status.MPI_SOURCE;
}